

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationRootElements::findPrimary(CollationRootElements *this,uint32_t p)

{
  int32_t iVar1;
  int32_t index;
  uint32_t p_local;
  CollationRootElements *this_local;
  
  iVar1 = findP(this,p);
  return iVar1;
}

Assistant:

int32_t
CollationRootElements::findPrimary(uint32_t p) const {
    // Requirement: p must occur as a root primary.
    U_ASSERT((p & 0xff) == 0);  // at most a 3-byte primary
    int32_t index = findP(p);
    // If p is in a range, then we just assume that p is an actual primary in this range.
    // (Too cumbersome/expensive to check.)
    // Otherwise, it must be an exact match.
    U_ASSERT(isEndOfPrimaryRange(elements[index + 1]) || p == (elements[index] & 0xffffff00));
    return index;
}